

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSchemaValidatePredefinedType(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val_00;
  uint local_44;
  int n_val;
  xmlSchemaValPtr *val;
  int n_value;
  xmlChar *value;
  int n_type;
  xmlSchemaTypePtr_conflict type;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (value._4_4_ = 0; (int)value._4_4_ < 1; value._4_4_ = value._4_4_ + 1) {
    for (val._4_4_ = 0; (int)val._4_4_ < 5; val._4_4_ = val._4_4_ + 1) {
      for (local_44 = 0; (int)local_44 < 1; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_const_xmlChar_ptr(val._4_4_,1);
        iVar2 = xmlSchemaValidatePredefinedType(0,val_00,0);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(val._4_4_,val_00,1);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidatePredefinedType",
                 (ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)value._4_4_);
          printf(" %d",(ulong)val._4_4_);
          printf(" %d",(ulong)local_44);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSchemaValidatePredefinedType(void) {
    int test_ret = 0;

#if defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlSchemaTypePtr type; /* the predefined type */
    int n_type;
    const xmlChar * value; /* the value to check */
    int n_value;
    xmlSchemaValPtr * val; /* the return computed value */
    int n_val;

    for (n_type = 0;n_type < gen_nb_xmlSchemaTypePtr;n_type++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
    for (n_val = 0;n_val < gen_nb_xmlSchemaValPtr_ptr;n_val++) {
        mem_base = xmlMemBlocks();
        type = gen_xmlSchemaTypePtr(n_type, 0);
        value = gen_const_xmlChar_ptr(n_value, 1);
        val = gen_xmlSchemaValPtr_ptr(n_val, 2);

        ret_val = xmlSchemaValidatePredefinedType(type, value, val);
        desret_int(ret_val);
        call_tests++;
        des_xmlSchemaTypePtr(n_type, type, 0);
        des_const_xmlChar_ptr(n_value, value, 1);
        des_xmlSchemaValPtr_ptr(n_val, val, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSchemaValidatePredefinedType",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_type);
            printf(" %d", n_value);
            printf(" %d", n_val);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}